

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall
Psbt_SetInputOnlySimpleWitness_Test::TestBody(Psbt_SetInputOnlySimpleWitness_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_4;
  Psbt psbt2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  CfdException *except_1;
  AssertionResult gtest_ar;
  CfdException *except;
  Transaction tx;
  KeyData key2;
  KeyData key1;
  string path2;
  string path1;
  HDWallet wallet2;
  HDWallet wallet1;
  Psbt psbt;
  bool *in_stack_fffffffffffff778;
  KeyData *in_stack_fffffffffffff780;
  undefined7 in_stack_fffffffffffff788;
  undefined1 in_stack_fffffffffffff78f;
  char *in_stack_fffffffffffff790;
  undefined7 in_stack_fffffffffffff798;
  undefined1 in_stack_fffffffffffff79f;
  AssertHelper local_810;
  Message local_808;
  string local_800 [32];
  AssertionResult local_7e0;
  ByteData local_7d0;
  Psbt local_7b8;
  AssertHelper local_738;
  Message local_730 [4];
  string local_710 [32];
  AssertionResult local_6f0;
  AssertHelper local_6e0;
  Message local_6d8;
  undefined1 local_6d0 [12];
  undefined4 local_6c4;
  SigHashType local_6c0 [12];
  undefined4 local_6b4;
  AssertionResult local_6b0;
  string local_6a0;
  AssertHelper local_680;
  Message local_678;
  byte local_669;
  AssertionResult local_668;
  string local_658;
  AssertHelper local_638;
  Message local_630;
  byte local_621;
  AssertionResult local_620 [3];
  undefined1 local_5e8 [120];
  AbstractTxInReference local_570;
  Transaction local_4e0 [64];
  KeyData local_4a0;
  undefined1 local_2c0 [343];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  ByteData local_120;
  HDWallet local_108 [24];
  ByteData local_f0;
  HDWallet local_d8 [47];
  allocator local_a9;
  string local_a8 [32];
  Psbt local_88;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA=="
             ,&local_a9);
  cfd::Psbt::Psbt(&local_88,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  cfd::core::ByteData::ByteData(&local_f0,(string *)&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(local_d8,&local_f0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2574d7);
  cfd::core::ByteData::ByteData(&local_120,(string *)&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(local_108,&local_120);
  cfd::core::ByteData::~ByteData((ByteData *)0x257511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"44h/0h/0h/1/1",&local_141);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"44h/0h/0h/0/1",&local_169);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  cfd::core::HDWallet::GeneratePubkeyData((NetType)local_2c0,(string *)local_d8);
  cfd::core::HDWallet::GeneratePubkeyData((int)&local_4a0 + 0x90,(string *)local_108);
  cfd::core::Psbt::GetTransaction();
  cfd::core::Transaction::Transaction(local_4e0,(string *)&g_psbt_utxo_witness_abi_cxx11_);
  cfd::core::Transaction::GetTxIn((uint)&local_570);
  cfd::core::AbstractTxInReference::GetVout(&local_570);
  cfd::core::Transaction::GetTxOut((uint)&local_4a0);
  cfd::core::Psbt::SetTxInUtxo((uint)&local_88,(TxOutReference *)0x0,&local_4a0);
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x25766f);
  cfd::core::TxInReference::~TxInReference((TxInReference *)0x25767c);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffff780);
  cfd::core::SigHashType::SigHashType((SigHashType *)(local_5e8 + 0x6c));
  cfd::core::Psbt::SetTxInSighashType((uint)&local_88,(SigHashType *)0x0);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffff780);
  cfd::core::Transaction::Transaction
            ((Transaction *)local_5e8,(string *)&g_psbt_utxo_legacy_abi_cxx11_);
  cfd::core::Psbt::SetTxInUtxo((uint)&local_88,(Transaction *)0x1,(KeyData *)local_5e8);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffff780);
  local_621 = cfd::core::Psbt::IsFindTxInSighashType((uint)&local_88);
  local_621 = local_621 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff780,in_stack_fffffffffffff778,(type *)0x257cb5
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_620);
  if (!bVar1) {
    testing::Message::Message(&local_630);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_658,(internal *)local_620,(AssertionResult *)"psbt.IsFindTxInSighashType(0)",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x370,pcVar3);
    testing::internal::AssertHelper::operator=(&local_638,&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    std::__cxx11::string::~string((string *)&local_658);
    testing::Message::~Message((Message *)0x257db4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x257e2c);
  bVar2 = cfd::core::Psbt::IsFindTxInSighashType((uint)&local_88);
  local_669 = ~bVar2 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff780,in_stack_fffffffffffff778,(type *)0x257e6c
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_668);
  if (!bVar1) {
    testing::Message::Message(&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6a0,(internal *)&local_668,(AssertionResult *)"psbt.IsFindTxInSighashType(1)",
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_680,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x371,pcVar3);
    testing::internal::AssertHelper::operator=(&local_680,&local_678);
    testing::internal::AssertHelper::~AssertHelper(&local_680);
    std::__cxx11::string::~string((string *)&local_6a0);
    testing::Message::~Message((Message *)0x257f64);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x257fdf);
  cfd::core::SigHashType::SigHashType(local_6c0);
  local_6b4 = cfd::core::SigHashType::GetSigHashFlag();
  cfd::core::Psbt::GetTxInSighashType((uint)local_6d0);
  local_6c4 = cfd::core::SigHashType::GetSigHashFlag();
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
             in_stack_fffffffffffff790,
             (uint *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),
             (uint *)in_stack_fffffffffffff780);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6b0);
  if (!bVar1) {
    testing::Message::Message(&local_6d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2580d9);
    testing::internal::AssertHelper::AssertHelper
              (&local_6e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x372,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6e0,&local_6d8);
    testing::internal::AssertHelper::~AssertHelper(&local_6e0);
    testing::Message::~Message((Message *)0x258136);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25818e);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_6f0,
             "\"70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff00000000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff00000000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000"
             ,pcVar3);
  std::__cxx11::string::~string(local_710);
  cfd::core::ByteData::~ByteData((ByteData *)0x25820a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6f0);
  if (!bVar1) {
    testing::Message::Message(local_730);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2582bc);
    testing::internal::AssertHelper::AssertHelper
              (&local_738,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x374,pcVar3);
    testing::internal::AssertHelper::operator=(&local_738,local_730);
    testing::internal::AssertHelper::~AssertHelper(&local_738);
    testing::Message::~Message((Message *)0x258319);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x258371);
  cfd::core::Psbt::GetData();
  cfd::Psbt::Psbt(&local_7b8,&local_7d0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2583ac);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_7e0,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA==\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA=="
             ,pcVar3);
  std::__cxx11::string::~string(local_800);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7e0);
  if (!bVar1) {
    testing::Message::Message(&local_808);
    in_stack_fffffffffffff780 =
         (KeyData *)testing::AssertionResult::failure_message((AssertionResult *)0x2584d5);
    testing::internal::AssertHelper::AssertHelper
              (&local_810,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x376,(char *)in_stack_fffffffffffff780);
    testing::internal::AssertHelper::operator=(&local_810,&local_808);
    testing::internal::AssertHelper::~AssertHelper(&local_810);
    testing::Message::~Message((Message *)0x258529);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25857b);
  cfd::Psbt::~Psbt((Psbt *)in_stack_fffffffffffff780);
  cfd::core::KeyData::~KeyData(in_stack_fffffffffffff780);
  cfd::core::KeyData::~KeyData(in_stack_fffffffffffff780);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_140);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x2585c9);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x2585d6);
  cfd::Psbt::~Psbt((Psbt *)in_stack_fffffffffffff780);
  return;
}

Assistant:

TEST(Psbt, SetInputOnlySimpleWitness) {
  Psbt psbt("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/1/1";
  std::string path2 = "44h/0h/0h/0/1";

  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  try {
    auto tx = psbt.GetTransaction();
    psbt.SetTxInUtxo(0, Transaction(g_psbt_utxo_witness).GetTxOut(tx.GetTxIn(0).GetVout()), key1);
    psbt.SetTxInSighashType(0, SigHashType());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    psbt.SetTxInUtxo(1, Transaction(g_psbt_utxo_legacy), key2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  EXPECT_TRUE(psbt.IsFindTxInSighashType(0));
  EXPECT_FALSE(psbt.IsFindTxInSighashType(1));
  EXPECT_EQ(SigHashType().GetSigHashFlag(), psbt.GetTxInSighashType(0).GetSigHashFlag());

  EXPECT_STREQ("70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff00000000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000", psbt.GetData().GetHex().c_str());
  Psbt psbt2(psbt.GetData());
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA==", psbt2.GetBase64().c_str());
}